

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O3

bool Js::ReportModuleCompletion(SourceTextModuleRecord *module,Var exception)

{
  bool bVar1;
  ScriptContext *scriptContext;
  Var aValue;
  ThreadContext *pTVar2;
  undefined1 uVar3;
  int iVar4;
  JavascriptString *pJVar5;
  undefined4 extraout_var;
  void *__frameAddr;
  undefined1 local_58 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  char16_t *pcVar6;
  
  scriptContext = (module->scriptContext).ptr;
  aValue = (module->normalizedSpecifier).ptr;
  if (aValue == (Var)0x0) {
    pcVar6 = L"module";
  }
  else {
    pJVar5 = VarTo<Js::JavascriptString>(aValue);
    iVar4 = (*(pJVar5->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])(pJVar5);
    pcVar6 = (char16_t *)CONCAT44(extraout_var,iVar4);
  }
  Output::TraceWithFlush(ModulePhase,L"ReportModuleCompletion %s\n",pcVar6);
  if (scriptContext->threadContext->isScriptActive == true) {
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_58,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar2 = scriptContext->threadContext;
    bVar1 = pTVar2->reentrancySafeOrHandled;
    pTVar2->reentrancySafeOrHandled = true;
    iVar4 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x16])
                      (scriptContext->hostScriptContext,module,exception);
    uVar3 = (undefined1)iVar4;
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
    pTVar2->reentrancySafeOrHandled = bVar1;
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_58);
  }
  else {
    local_58._0_4_ = ExceptionCheck::Save();
    iVar4 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x16])
                      (scriptContext->hostScriptContext,module,exception);
    uVar3 = (undefined1)iVar4;
    ExceptionCheck::Restore((Data *)local_58);
  }
  return (bool)uVar3;
}

Assistant:

static bool ReportModuleCompletion(SourceTextModuleRecord* module, Var exception)
    {
        bool hasCallback = false;
        ScriptContext* scriptContext = module->GetScriptContext();
        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("ReportModuleCompletion %s\n"), module->GetSpecifierSz());
        LEAVE_SCRIPT_IF_ACTIVE(scriptContext,
        {
            hasCallback = scriptContext->GetHostScriptContext()->ReportModuleCompletion(module, exception);
        });
        return hasCallback;
    }